

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  undefined1 auVar2 [16];
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  bool bVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong unaff_R15;
  size_t mask;
  bool bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar74;
  undefined4 uVar75;
  undefined1 auVar76 [32];
  float fVar77;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  uint uVar92;
  uint uVar94;
  uint uVar95;
  uint uVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [564];
  int local_1564;
  RTCIntersectArguments *local_1560;
  long local_1558;
  long local_1550;
  long local_1548;
  long local_1540;
  long local_1538;
  long local_1530;
  ulong local_1528;
  ulong *local_1520;
  Scene *local_1518;
  ulong local_1510;
  ulong local_1508;
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  uint local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  byte local_135f;
  float local_1340 [4];
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  undefined4 uStack_1324;
  undefined1 local_1320 [32];
  float local_1300 [4];
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  ulong local_1200 [570];
  
  uVar35 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar35 != 8) {
    fVar77 = ray->tfar;
    vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar63 = vucomiss_avx512f(ZEXT416((uint)fVar77));
    auVar106 = ZEXT1664(auVar63);
    if (uVar35 < 9) {
      local_1520 = local_1200 + 1;
      aVar1 = (ray->dir).field_0.field_1;
      auVar39 = vmaxss_avx512f(auVar63,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar40 = vandps_avx512vl((undefined1  [16])aVar1,auVar40);
      auVar57._8_4_ = 0x219392ef;
      auVar57._0_8_ = 0x219392ef219392ef;
      auVar57._12_4_ = 0x219392ef;
      uVar35 = vcmpps_avx512vl(auVar40,auVar57,1);
      bVar37 = (bool)((byte)uVar35 & 1);
      auVar54._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * (int)aVar1.x;
      bVar37 = (bool)((byte)(uVar35 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * (int)aVar1.y;
      bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * (int)aVar1.z;
      bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * aVar1.field_3.a;
      auVar40 = vrcp14ps_avx512vl(auVar54);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = &DAT_3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar41 = vfnmadd213ps_avx512vl(auVar54,auVar40,auVar41);
      local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      vfmadd132ps_fma(auVar41,auVar40,auVar40);
      auVar41 = vucomiss_avx512f(auVar63);
      auVar66 = vbroadcastss_avx512vl(auVar41);
      auVar107 = ZEXT3264(auVar66);
      auVar40 = vmovshdup_avx(auVar41);
      auVar66 = vbroadcastsd_avx512vl(auVar40);
      auVar108 = ZEXT3264(auVar66);
      vshufpd_avx(auVar41,auVar41,1);
      auVar68._8_4_ = 2;
      auVar68._0_8_ = 0x200000002;
      auVar68._12_4_ = 2;
      auVar68._16_4_ = 2;
      auVar68._20_4_ = 2;
      auVar68._24_4_ = 2;
      auVar68._28_4_ = 2;
      local_1400 = vpermps_avx2(auVar68,ZEXT1632(auVar41));
      auVar91 = ZEXT3264(local_1400);
      fVar74 = auVar41._0_4_ * (ray->org).field_0.m128[0];
      auVar66._8_4_ = 1;
      auVar66._0_8_ = 0x100000001;
      auVar66._12_4_ = 1;
      auVar66._16_4_ = 1;
      auVar66._20_4_ = 1;
      auVar66._24_4_ = 1;
      auVar66._28_4_ = 1;
      auVar67 = ZEXT1632(CONCAT412(auVar41._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar41._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar41._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar74))));
      auVar66 = vpermps_avx2(auVar66,auVar67);
      auVar67 = vpermps_avx2(auVar68,auVar67);
      lVar27 = 0;
      vucomiss_avx512f(auVar63);
      lVar29 = 0x40;
      vucomiss_avx512f(auVar63);
      lVar31 = 0x80;
      lVar32 = 0x20;
      lVar33 = 0x60;
      lVar34 = 0xa0;
      uVar75 = auVar39._0_4_;
      local_1420._4_4_ = uVar75;
      local_1420._0_4_ = uVar75;
      local_1420._8_4_ = uVar75;
      local_1420._12_4_ = uVar75;
      local_1420._16_4_ = uVar75;
      local_1420._20_4_ = uVar75;
      local_1420._24_4_ = uVar75;
      local_1420._28_4_ = uVar75;
      auVar83 = ZEXT3264(local_1420);
      local_1440._4_4_ = fVar77;
      local_1440._0_4_ = fVar77;
      local_1440._8_4_ = fVar77;
      local_1440._12_4_ = fVar77;
      local_1440._16_4_ = fVar77;
      local_1440._20_4_ = fVar77;
      local_1440._24_4_ = fVar77;
      local_1440._28_4_ = fVar77;
      auVar93 = ZEXT3264(local_1440);
      local_1460._0_8_ = CONCAT44(fVar74,fVar74) ^ 0x8000000080000000;
      local_1460._8_4_ = -fVar74;
      local_1460._12_4_ = -fVar74;
      local_1460._16_4_ = -fVar74;
      local_1460._20_4_ = -fVar74;
      local_1460._24_4_ = -fVar74;
      local_1460._28_4_ = -fVar74;
      auVar85 = ZEXT3264(local_1460);
      local_1480._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
      local_1480._8_4_ = auVar66._8_4_ ^ 0x80000000;
      local_1480._12_4_ = auVar66._12_4_ ^ 0x80000000;
      local_1480._16_4_ = auVar66._16_4_ ^ 0x80000000;
      local_1480._20_4_ = auVar66._20_4_ ^ 0x80000000;
      local_1480._24_4_ = auVar66._24_4_ ^ 0x80000000;
      local_1480._28_4_ = auVar66._28_4_ ^ 0x80000000;
      auVar88 = ZEXT3264(local_1480);
      local_14a0._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
      local_14a0._8_4_ = auVar67._8_4_ ^ 0x80000000;
      local_14a0._12_4_ = auVar67._12_4_ ^ 0x80000000;
      local_14a0._16_4_ = auVar67._16_4_ ^ 0x80000000;
      local_14a0._20_4_ = auVar67._20_4_ ^ 0x80000000;
      local_14a0._24_4_ = auVar67._24_4_ ^ 0x80000000;
      local_14a0._28_4_ = auVar67._28_4_ ^ 0x80000000;
      auVar102 = ZEXT3264(local_14a0);
      local_1530 = 0;
      local_1538 = 0x40;
      local_1540 = 0x80;
      local_1548 = 0x20;
      local_1550 = 0x60;
      local_1558 = 0xa0;
      do {
        if (local_1520 == local_1200) {
          return;
        }
        uVar35 = local_1520[-1];
        local_1520 = local_1520 + -1;
        local_1528 = unaff_R15;
        do {
          if ((uVar35 & 8) == 0) {
            uVar22 = uVar35 & 0xfffffffffffffff0;
            uVar75 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar72._4_4_ = uVar75;
            auVar72._0_4_ = uVar75;
            auVar72._8_4_ = uVar75;
            auVar72._12_4_ = uVar75;
            auVar72._16_4_ = uVar75;
            auVar72._20_4_ = uVar75;
            auVar72._24_4_ = uVar75;
            auVar72._28_4_ = uVar75;
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100 + lVar27),auVar72,
                                      *(undefined1 (*) [32])(uVar22 + 0x40 + lVar27));
            auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar63),auVar107._0_32_,auVar85._0_32_);
            auVar66 = vmaxps_avx(auVar83._0_32_,auVar66);
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100 + lVar29),auVar72,
                                      *(undefined1 (*) [32])(uVar22 + 0x40 + lVar29));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100 + lVar31),auVar72,
                                      *(undefined1 (*) [32])(uVar22 + 0x40 + lVar31));
            auVar67 = vfmadd213ps_avx512vl(ZEXT1632(auVar63),auVar108._0_32_,auVar88._0_32_);
            auVar63 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar91._0_32_,auVar102._0_32_);
            auVar67 = vmaxps_avx(auVar67,ZEXT1632(auVar63));
            auVar66 = vmaxps_avx(auVar66,auVar67);
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100 + lVar32),auVar72,
                                      *(undefined1 (*) [32])(uVar22 + 0x40 + lVar32));
            auVar67 = vfmadd213ps_avx512vl(ZEXT1632(auVar63),auVar107._0_32_,auVar85._0_32_);
            auVar67 = vminps_avx(auVar93._0_32_,auVar67);
            auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100 + lVar33),auVar72,
                                      *(undefined1 (*) [32])(uVar22 + 0x40 + lVar33));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100 + lVar34),auVar72,
                                      *(undefined1 (*) [32])(uVar22 + 0x40 + lVar34));
            auVar68 = vfmadd213ps_avx512vl(ZEXT1632(auVar63),auVar108._0_32_,auVar88._0_32_);
            auVar63 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar91._0_32_,auVar102._0_32_);
            auVar68 = vminps_avx(auVar68,ZEXT1632(auVar63));
            auVar67 = vminps_avx(auVar67,auVar68);
            if (((uint)uVar35 & 7) == 6) {
              uVar7 = vcmpps_avx512vl(auVar66,auVar67,2);
              uVar8 = vcmpps_avx512vl(auVar72,*(undefined1 (*) [32])(uVar22 + 0x1c0),0xd);
              uVar9 = vcmpps_avx512vl(auVar72,*(undefined1 (*) [32])(uVar22 + 0x1e0),1);
              bVar38 = (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
            }
            else {
              uVar7 = vcmpps_avx512vl(auVar66,auVar67,2);
              bVar38 = (byte)uVar7;
            }
            local_1528 = CONCAT44((int)(local_1528 >> 0x20),(uint)bVar38);
          }
          if ((uVar35 & 8) == 0) {
            if (local_1528 == 0) {
              iVar26 = 4;
            }
            else {
              uVar22 = uVar35 & 0xfffffffffffffff0;
              lVar24 = 0;
              for (uVar35 = local_1528; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000
                  ) {
                lVar24 = lVar24 + 1;
              }
              iVar26 = 0;
              for (uVar23 = local_1528 - 1 & local_1528; uVar35 = *(ulong *)(uVar22 + lVar24 * 8),
                  uVar23 != 0; uVar23 = uVar23 - 1 & uVar23) {
                *local_1520 = uVar35;
                local_1520 = local_1520 + 1;
                lVar24 = 0;
                for (uVar35 = uVar23; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000)
                {
                  lVar24 = lVar24 + 1;
                }
              }
            }
          }
          else {
            iVar26 = 6;
          }
        } while (iVar26 == 0);
        if (iVar26 == 6) {
          iVar26 = 0;
          local_1508 = (ulong)((uint)uVar35 & 0xf) - 8;
          bVar37 = local_1508 != 0;
          if (bVar37) {
            uVar35 = uVar35 & 0xfffffffffffffff0;
            local_1518 = context->scene;
            uVar22 = 0;
            do {
              lVar29 = uVar22 * 0x60;
              pRVar3 = (local_1518->geometries).items;
              pGVar4 = pRVar3[*(uint *)(uVar35 + 0x40 + lVar29)].ptr;
              fVar77 = (pGVar4->time_range).lower;
              fVar77 = pGVar4->fnumTimeSegments *
                       (((ray->dir).field_0.m128[3] - fVar77) /
                       ((pGVar4->time_range).upper - fVar77));
              auVar63 = vroundss_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77),9);
              auVar63 = vminss_avx(auVar63,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
              auVar42 = vmaxss_avx512f(auVar106._0_16_,auVar63);
              iVar26 = (int)auVar42._0_4_;
              lVar33 = (long)iVar26 * 0x38;
              lVar27 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar33);
              auVar63 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar35 + lVar29) * 4);
              uVar28 = (ulong)*(uint *)(uVar35 + 0x10 + lVar29);
              auVar40 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
              uVar25 = (ulong)*(uint *)(uVar35 + 0x20 + lVar29);
              auVar41 = *(undefined1 (*) [16])(lVar27 + uVar25 * 4);
              uVar30 = (ulong)*(uint *)(uVar35 + 0x30 + lVar29);
              auVar39 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
              uVar23 = (ulong)*(uint *)(uVar35 + 4 + lVar29);
              lVar34 = (long)(iVar26 + 1) * 0x38;
              lVar27 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar34);
              auVar54 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar35 + lVar29) * 4);
              auVar57 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
              lVar31 = *(long *)&pRVar3[*(uint *)(uVar35 + 0x44 + lVar29)].ptr[2].numPrimitives;
              lVar32 = *(long *)(lVar31 + lVar33);
              auVar46 = *(undefined1 (*) [16])(lVar32 + uVar23 * 4);
              auVar60 = *(undefined1 (*) [16])(lVar27 + uVar25 * 4);
              uVar28 = (ulong)*(uint *)(uVar35 + 0x14 + lVar29);
              auVar48 = *(undefined1 (*) [16])(lVar32 + uVar28 * 4);
              auVar64 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
              uVar25 = (ulong)*(uint *)(uVar35 + 0x24 + lVar29);
              auVar51 = *(undefined1 (*) [16])(lVar32 + uVar25 * 4);
              uVar30 = (ulong)*(uint *)(uVar35 + 0x34 + lVar29);
              auVar53 = *(undefined1 (*) [16])(lVar32 + uVar30 * 4);
              lVar27 = *(long *)&pRVar3[*(uint *)(uVar35 + 0x48 + lVar29)].ptr[2].numPrimitives;
              lVar31 = *(long *)(lVar31 + lVar34);
              auVar56 = *(undefined1 (*) [16])(lVar31 + uVar23 * 4);
              lVar32 = *(long *)(lVar27 + lVar33);
              auVar59 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
              uVar28 = (ulong)*(uint *)(uVar35 + 8 + lVar29);
              auVar2 = *(undefined1 (*) [16])(lVar32 + uVar28 * 4);
              auVar61 = *(undefined1 (*) [16])(lVar31 + uVar25 * 4);
              uVar23 = (ulong)*(uint *)(uVar35 + 0x18 + lVar29);
              auVar47 = *(undefined1 (*) [16])(lVar32 + uVar23 * 4);
              auVar65 = *(undefined1 (*) [16])(lVar31 + uVar30 * 4);
              uVar25 = (ulong)*(uint *)(uVar35 + 0x28 + lVar29);
              auVar50 = *(undefined1 (*) [16])(lVar32 + uVar25 * 4);
              uVar36 = (ulong)*(uint *)(uVar35 + 0x38 + lVar29);
              auVar52 = *(undefined1 (*) [16])(lVar32 + uVar36 * 4);
              lVar27 = *(long *)(lVar27 + lVar34);
              auVar55 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
              lVar31 = *(long *)&pRVar3[*(uint *)(uVar35 + 0x4c + lVar29)].ptr[2].numPrimitives;
              lVar32 = *(long *)(lVar31 + lVar33);
              auVar58 = *(undefined1 (*) [16])(lVar27 + uVar23 * 4);
              uVar30 = (ulong)*(uint *)(uVar35 + 0xc + lVar29);
              auVar44 = *(undefined1 (*) [16])(lVar32 + uVar30 * 4);
              auVar62 = *(undefined1 (*) [16])(lVar27 + uVar25 * 4);
              uVar25 = (ulong)*(uint *)(uVar35 + 0x1c + lVar29);
              auVar49 = *(undefined1 (*) [16])(lVar32 + uVar25 * 4);
              auVar43 = vunpcklps_avx512vl(auVar63,auVar2);
              auVar2 = vunpckhps_avx(auVar63,auVar2);
              auVar45 = vunpcklps_avx(auVar46,auVar44);
              auVar46 = vunpckhps_avx(auVar46,auVar44);
              auVar63 = *(undefined1 (*) [16])(lVar27 + uVar36 * 4);
              uVar23 = (ulong)*(uint *)(uVar35 + 0x2c + lVar29);
              auVar2 = vunpcklps_avx(auVar2,auVar46);
              auVar44 = vunpcklps_avx512vl(auVar43,auVar45);
              auVar45 = vunpckhps_avx512vl(auVar43,auVar45);
              auVar46 = vunpcklps_avx512vl(auVar40,auVar47);
              auVar47 = vunpckhps_avx512vl(auVar40,auVar47);
              auVar43 = vunpcklps_avx512vl(auVar48,auVar49);
              auVar48 = vunpckhps_avx512vl(auVar48,auVar49);
              auVar40 = *(undefined1 (*) [16])(lVar32 + uVar23 * 4);
              uVar28 = (ulong)*(uint *)(uVar35 + 0x3c + lVar29);
              auVar48 = vunpcklps_avx(auVar47,auVar48);
              auVar47 = vunpcklps_avx512vl(auVar46,auVar43);
              auVar46 = vunpckhps_avx(auVar46,auVar43);
              auVar49 = vunpcklps_avx512vl(auVar41,auVar50);
              auVar50 = vunpckhps_avx512vl(auVar41,auVar50);
              auVar43 = vunpcklps_avx512vl(auVar51,auVar40);
              auVar41 = vunpckhps_avx(auVar51,auVar40);
              auVar40 = *(undefined1 (*) [16])(lVar32 + uVar28 * 4);
              lVar27 = *(long *)(lVar31 + lVar34);
              auVar41 = vunpcklps_avx(auVar50,auVar41);
              auVar51 = vunpcklps_avx512vl(auVar49,auVar43);
              auVar50 = vunpckhps_avx512vl(auVar49,auVar43);
              auVar49 = vunpcklps_avx512vl(auVar39,auVar52);
              auVar39 = vunpckhps_avx512vl(auVar39,auVar52);
              auVar52 = vunpcklps_avx512vl(auVar53,auVar40);
              auVar53 = vunpckhps_avx512vl(auVar53,auVar40);
              auVar40 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
              auVar39 = vunpcklps_avx(auVar39,auVar53);
              auVar53 = vunpcklps_avx512vl(auVar49,auVar52);
              auVar52 = vunpckhps_avx512vl(auVar49,auVar52);
              auVar49 = vunpcklps_avx512vl(auVar54,auVar55);
              auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
              auVar55 = vunpcklps_avx512vl(auVar56,auVar40);
              auVar56 = vunpckhps_avx512vl(auVar56,auVar40);
              auVar40 = *(undefined1 (*) [16])(lVar27 + uVar25 * 4);
              auVar56 = vunpcklps_avx512vl(auVar54,auVar56);
              auVar43 = vunpcklps_avx512vl(auVar49,auVar55);
              auVar55 = vunpckhps_avx512vl(auVar49,auVar55);
              auVar54 = vunpcklps_avx512vl(auVar57,auVar58);
              auVar57 = vunpckhps_avx512vl(auVar57,auVar58);
              auVar58 = vunpcklps_avx512vl(auVar59,auVar40);
              auVar59 = vunpckhps_avx512vl(auVar59,auVar40);
              auVar40 = *(undefined1 (*) [16])(lVar27 + uVar23 * 4);
              auVar57 = vunpcklps_avx512vl(auVar57,auVar59);
              auVar59 = vunpcklps_avx512vl(auVar54,auVar58);
              auVar58 = vunpckhps_avx512vl(auVar54,auVar58);
              auVar49 = vunpcklps_avx512vl(auVar60,auVar62);
              auVar54 = vunpckhps_avx512vl(auVar60,auVar62);
              auVar60 = vunpcklps_avx512vl(auVar61,auVar40);
              auVar61 = vunpckhps_avx512vl(auVar61,auVar40);
              auVar40 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
              auVar54 = vunpcklps_avx(auVar54,auVar61);
              auVar61 = vunpcklps_avx512vl(auVar49,auVar60);
              auVar60 = vunpckhps_avx512vl(auVar49,auVar60);
              auVar62 = vunpcklps_avx512vl(auVar64,auVar63);
              auVar63 = vunpckhps_avx512vl(auVar64,auVar63);
              auVar64 = vunpcklps_avx512vl(auVar65,auVar40);
              auVar40 = vunpckhps_avx512vl(auVar65,auVar40);
              auVar63 = vunpcklps_avx(auVar63,auVar40);
              auVar65 = vunpcklps_avx512vl(auVar62,auVar64);
              auVar64 = vunpckhps_avx512vl(auVar62,auVar64);
              auVar40 = ZEXT416((uint)(fVar77 - auVar42._0_4_));
              auVar62 = vbroadcastss_avx512vl(auVar40);
              auVar40 = vsubss_avx512f(ZEXT416(0x3f800000),auVar40);
              auVar49._0_4_ = auVar40._0_4_;
              auVar49._4_4_ = auVar49._0_4_;
              auVar49._8_4_ = auVar49._0_4_;
              auVar49._12_4_ = auVar49._0_4_;
              auVar40 = vmulps_avx512vl(auVar62,auVar43);
              auVar44 = vfmadd231ps_avx512vl(auVar40,auVar49,auVar44);
              auVar40 = vmulps_avx512vl(auVar62,auVar55);
              auVar55 = vfmadd231ps_avx512vl(auVar40,auVar49,auVar45);
              auVar40 = vmulps_avx512vl(auVar62,auVar56);
              auVar40 = vfmadd231ps_fma(auVar40,auVar49,auVar2);
              auVar56 = vmulps_avx512vl(auVar62,auVar59);
              auVar56 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar47);
              auVar59 = vmulps_avx512vl(auVar62,auVar58);
              auVar59 = vfmadd231ps_avx512vl(auVar59,auVar49,auVar46);
              auVar57 = vmulps_avx512vl(auVar62,auVar57);
              auVar57 = vfmadd231ps_fma(auVar57,auVar49,auVar48);
              auVar46 = vmulps_avx512vl(auVar62,auVar61);
              auVar46 = vfmadd231ps_fma(auVar46,auVar49,auVar51);
              auVar60 = vmulps_avx512vl(auVar62,auVar60);
              auVar60 = vfmadd231ps_fma(auVar60,auVar49,auVar50);
              auVar54 = vmulps_avx512vl(auVar62,auVar54);
              auVar41 = vfmadd231ps_fma(auVar54,auVar49,auVar41);
              auVar54 = vmulps_avx512vl(auVar62,auVar65);
              auVar48 = vmulps_avx512vl(auVar62,auVar64);
              auVar64 = vmulps_avx512vl(auVar62,auVar63);
              auVar63 = vfmadd231ps_fma(auVar54,auVar49,auVar53);
              lVar27 = uVar35 + 0x40 + lVar29;
              local_1220 = *(undefined8 *)(lVar27 + 0x10);
              uStack_1218 = *(undefined8 *)(lVar27 + 0x18);
              auVar54 = vfmadd231ps_fma(auVar48,auVar49,auVar52);
              uStack_1210 = local_1220;
              uStack_1208 = uStack_1218;
              lVar29 = uVar35 + 0x50 + lVar29;
              local_1240 = *(undefined8 *)(lVar29 + 0x10);
              uStack_1238 = *(undefined8 *)(lVar29 + 0x18);
              auVar39 = vfmadd231ps_fma(auVar64,auVar49,auVar39);
              uStack_1230 = local_1240;
              uStack_1228 = uStack_1238;
              auVar69 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar46,1);
              auVar70 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar60,1);
              auVar86._16_16_ = auVar41;
              auVar86._0_16_ = auVar40;
              auVar73._16_16_ = auVar56;
              auVar73._0_16_ = auVar56;
              auVar71 = vinsertf32x4_avx512vl(ZEXT1632(auVar59),auVar59,1);
              auVar82._16_16_ = auVar57;
              auVar82._0_16_ = auVar57;
              auVar76._16_16_ = auVar63;
              auVar76._0_16_ = auVar63;
              auVar89._16_16_ = auVar54;
              auVar89._0_16_ = auVar54;
              auVar84._16_16_ = auVar39;
              auVar84._0_16_ = auVar39;
              auVar66 = vsubps_avx(auVar69,auVar73);
              auVar67 = vsubps_avx(auVar70,auVar71);
              auVar68 = vsubps_avx(auVar86,auVar82);
              auVar72 = vsubps_avx(auVar76,auVar69);
              auVar5 = vsubps_avx(auVar89,auVar70);
              auVar6 = vsubps_avx(auVar84,auVar86);
              auVar15._4_4_ = auVar67._4_4_ * auVar6._4_4_;
              auVar15._0_4_ = auVar67._0_4_ * auVar6._0_4_;
              auVar15._8_4_ = auVar67._8_4_ * auVar6._8_4_;
              auVar15._12_4_ = auVar67._12_4_ * auVar6._12_4_;
              auVar15._16_4_ = auVar67._16_4_ * auVar6._16_4_;
              auVar15._20_4_ = auVar67._20_4_ * auVar6._20_4_;
              auVar15._24_4_ = auVar67._24_4_ * auVar6._24_4_;
              auVar15._28_4_ = auVar56._12_4_;
              auVar39 = vfmsub231ps_fma(auVar15,auVar5,auVar68);
              auVar16._4_4_ = auVar72._4_4_ * auVar68._4_4_;
              auVar16._0_4_ = auVar72._0_4_ * auVar68._0_4_;
              auVar16._8_4_ = auVar72._8_4_ * auVar68._8_4_;
              auVar16._12_4_ = auVar72._12_4_ * auVar68._12_4_;
              auVar16._16_4_ = auVar72._16_4_ * auVar68._16_4_;
              auVar16._20_4_ = auVar72._20_4_ * auVar68._20_4_;
              auVar16._24_4_ = auVar72._24_4_ * auVar68._24_4_;
              auVar16._28_4_ = auVar71._28_4_;
              fVar77 = (ray->dir).field_0.m128[0];
              auVar103._4_4_ = fVar77;
              auVar103._0_4_ = fVar77;
              auVar103._8_4_ = fVar77;
              auVar103._12_4_ = fVar77;
              auVar103._16_4_ = fVar77;
              auVar103._20_4_ = fVar77;
              auVar103._24_4_ = fVar77;
              auVar103._28_4_ = fVar77;
              fVar74 = (ray->dir).field_0.m128[1];
              auVar104._4_4_ = fVar74;
              auVar104._0_4_ = fVar74;
              auVar104._8_4_ = fVar74;
              auVar104._12_4_ = fVar74;
              auVar104._16_4_ = fVar74;
              auVar104._20_4_ = fVar74;
              auVar104._24_4_ = fVar74;
              auVar104._28_4_ = fVar74;
              fVar97 = (ray->dir).field_0.m128[2];
              auVar105._4_4_ = fVar97;
              auVar105._0_4_ = fVar97;
              auVar105._8_4_ = fVar97;
              auVar105._12_4_ = fVar97;
              auVar105._16_4_ = fVar97;
              auVar105._20_4_ = fVar97;
              auVar105._24_4_ = fVar97;
              auVar105._28_4_ = fVar97;
              uVar75 = *(undefined4 *)&(ray->org).field_0;
              auVar71._4_4_ = uVar75;
              auVar71._0_4_ = uVar75;
              auVar71._8_4_ = uVar75;
              auVar71._12_4_ = uVar75;
              auVar71._16_4_ = uVar75;
              auVar71._20_4_ = uVar75;
              auVar71._24_4_ = uVar75;
              auVar71._28_4_ = uVar75;
              auVar71 = vsubps_avx512vl(auVar69,auVar71);
              uVar75 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar69._4_4_ = uVar75;
              auVar69._0_4_ = uVar75;
              auVar69._8_4_ = uVar75;
              auVar69._12_4_ = uVar75;
              auVar69._16_4_ = uVar75;
              auVar69._20_4_ = uVar75;
              auVar69._24_4_ = uVar75;
              auVar69._28_4_ = uVar75;
              auVar69 = vsubps_avx512vl(auVar70,auVar69);
              auVar54 = vfmsub231ps_fma(auVar16,auVar6,auVar66);
              uVar75 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar11._4_4_ = uVar75;
              auVar11._0_4_ = uVar75;
              auVar11._8_4_ = uVar75;
              auVar11._12_4_ = uVar75;
              auVar11._16_4_ = uVar75;
              auVar11._20_4_ = uVar75;
              auVar11._24_4_ = uVar75;
              auVar11._28_4_ = uVar75;
              local_1380 = vsubps_avx512vl(auVar86,auVar11);
              auVar17._4_4_ = fVar77 * auVar69._4_4_;
              auVar17._0_4_ = fVar77 * auVar69._0_4_;
              auVar17._8_4_ = fVar77 * auVar69._8_4_;
              auVar17._12_4_ = fVar77 * auVar69._12_4_;
              auVar17._16_4_ = fVar77 * auVar69._16_4_;
              auVar17._20_4_ = fVar77 * auVar69._20_4_;
              auVar17._24_4_ = fVar77 * auVar69._24_4_;
              auVar17._28_4_ = auVar70._28_4_;
              auVar63 = vfmsub231ps_fma(auVar17,auVar71,auVar104);
              auVar70._4_4_ = auVar6._4_4_ * auVar63._4_4_;
              auVar70._0_4_ = auVar6._0_4_ * auVar63._0_4_;
              auVar70._8_4_ = auVar6._8_4_ * auVar63._8_4_;
              auVar70._12_4_ = auVar6._12_4_ * auVar63._12_4_;
              auVar70._16_4_ = auVar6._16_4_ * 0.0;
              auVar70._20_4_ = auVar6._20_4_ * 0.0;
              auVar70._24_4_ = auVar6._24_4_ * 0.0;
              auVar70._28_4_ = auVar41._12_4_;
              auVar18._4_4_ = auVar68._4_4_ * auVar63._4_4_;
              auVar18._0_4_ = auVar68._0_4_ * auVar63._0_4_;
              auVar18._8_4_ = auVar68._8_4_ * auVar63._8_4_;
              auVar18._12_4_ = auVar68._12_4_ * auVar63._12_4_;
              auVar18._16_4_ = auVar68._16_4_ * 0.0;
              auVar18._20_4_ = auVar68._20_4_ * 0.0;
              auVar18._24_4_ = auVar68._24_4_ * 0.0;
              auVar18._28_4_ = auVar6._28_4_;
              auVar78._0_4_ = fVar97 * auVar71._0_4_;
              auVar78._4_4_ = fVar97 * auVar71._4_4_;
              auVar78._8_4_ = fVar97 * auVar71._8_4_;
              auVar78._12_4_ = fVar97 * auVar71._12_4_;
              auVar78._16_4_ = fVar97 * auVar71._16_4_;
              auVar78._20_4_ = fVar97 * auVar71._20_4_;
              auVar78._24_4_ = fVar97 * auVar71._24_4_;
              auVar78._28_4_ = 0;
              auVar40 = vfmsub231ps_fma(auVar78,local_1380,auVar103);
              auVar63 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar40),auVar5);
              auVar40 = vfmadd231ps_fma(auVar18,auVar67,ZEXT1632(auVar40));
              auVar6._4_4_ = auVar66._4_4_ * auVar5._4_4_;
              auVar6._0_4_ = auVar66._0_4_ * auVar5._0_4_;
              auVar6._8_4_ = auVar66._8_4_ * auVar5._8_4_;
              auVar6._12_4_ = auVar66._12_4_ * auVar5._12_4_;
              auVar6._16_4_ = auVar66._16_4_ * auVar5._16_4_;
              auVar6._20_4_ = auVar66._20_4_ * auVar5._20_4_;
              auVar6._24_4_ = auVar66._24_4_ * auVar5._24_4_;
              auVar6._28_4_ = auVar68._28_4_;
              auVar41 = vfmsub231ps_fma(auVar6,auVar72,auVar67);
              auVar79._0_4_ = fVar74 * local_1380._0_4_;
              auVar79._4_4_ = fVar74 * local_1380._4_4_;
              auVar79._8_4_ = fVar74 * local_1380._8_4_;
              auVar79._12_4_ = fVar74 * local_1380._12_4_;
              auVar79._16_4_ = fVar74 * local_1380._16_4_;
              auVar79._20_4_ = fVar74 * local_1380._20_4_;
              auVar79._24_4_ = fVar74 * local_1380._24_4_;
              auVar79._28_4_ = 0;
              auVar57 = vfmsub231ps_fma(auVar79,auVar69,auVar105);
              fVar77 = auVar41._0_4_;
              fVar74 = auVar41._4_4_;
              auVar19._4_4_ = fVar97 * fVar74;
              auVar19._0_4_ = fVar97 * fVar77;
              fVar80 = auVar41._8_4_;
              auVar19._8_4_ = fVar97 * fVar80;
              fVar81 = auVar41._12_4_;
              auVar19._12_4_ = fVar97 * fVar81;
              auVar19._16_4_ = fVar97 * 0.0;
              auVar19._20_4_ = fVar97 * 0.0;
              auVar19._24_4_ = fVar97 * 0.0;
              auVar19._28_4_ = auVar67._28_4_;
              auVar41 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar54),auVar104);
              auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),ZEXT1632(auVar39),auVar103);
              auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),ZEXT1632(auVar57),auVar72);
              auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar66,ZEXT1632(auVar57));
              auVar67._8_4_ = 0x7fffffff;
              auVar67._0_8_ = 0x7fffffff7fffffff;
              auVar67._12_4_ = 0x7fffffff;
              auVar67._16_4_ = 0x7fffffff;
              auVar67._20_4_ = 0x7fffffff;
              auVar67._24_4_ = 0x7fffffff;
              auVar67._28_4_ = 0x7fffffff;
              vandps_avx512vl(ZEXT1632(auVar41),auVar67);
              auVar5._8_4_ = 0x80000000;
              auVar5._0_8_ = 0x8000000080000000;
              auVar5._12_4_ = 0x80000000;
              auVar5._16_4_ = 0x80000000;
              auVar5._20_4_ = 0x80000000;
              auVar5._24_4_ = 0x80000000;
              auVar5._28_4_ = 0x80000000;
              auVar66 = vandpd_avx512vl(ZEXT1632(auVar41),auVar5);
              uVar92 = auVar66._0_4_;
              auVar87._0_4_ = (float)(uVar92 ^ auVar63._0_4_);
              uVar94 = auVar66._4_4_;
              auVar87._4_4_ = (float)(uVar94 ^ auVar63._4_4_);
              uVar95 = auVar66._8_4_;
              auVar87._8_4_ = (float)(uVar95 ^ auVar63._8_4_);
              uVar96 = auVar66._12_4_;
              auVar87._12_4_ = (float)(uVar96 ^ auVar63._12_4_);
              fVar97 = auVar66._16_4_;
              auVar87._16_4_ = fVar97;
              fVar98 = auVar66._20_4_;
              auVar87._20_4_ = fVar98;
              fVar99 = auVar66._24_4_;
              auVar87._24_4_ = fVar99;
              fVar100 = auVar66._28_4_;
              auVar87._28_4_ = fVar100;
              auVar90._0_4_ = (float)(uVar92 ^ auVar40._0_4_);
              auVar90._4_4_ = (float)(uVar94 ^ auVar40._4_4_);
              auVar90._8_4_ = (float)(uVar95 ^ auVar40._8_4_);
              auVar90._12_4_ = (float)(uVar96 ^ auVar40._12_4_);
              auVar90._16_4_ = fVar97;
              auVar90._20_4_ = fVar98;
              auVar90._24_4_ = fVar99;
              auVar90._28_4_ = fVar100;
              uVar7 = vcmpps_avx512vl(auVar87,ZEXT832(0) << 0x20,5);
              uVar8 = vcmpps_avx512vl(auVar90,ZEXT832(0) << 0x20,5);
              uVar9 = vcmpps_avx512vl(ZEXT1632(auVar41),ZEXT832(0) << 0x20,4);
              auVar101._0_4_ = auVar90._0_4_ + auVar87._0_4_;
              auVar101._4_4_ = auVar90._4_4_ + auVar87._4_4_;
              auVar101._8_4_ = auVar90._8_4_ + auVar87._8_4_;
              auVar101._12_4_ = auVar90._12_4_ + auVar87._12_4_;
              auVar101._16_4_ = fVar97 + fVar97;
              auVar101._20_4_ = fVar98 + fVar98;
              auVar101._24_4_ = fVar99 + fVar99;
              auVar101._28_4_ = fVar100 + fVar100;
              uVar10 = vcmpps_avx512vl(auVar101,local_1380,2);
              local_135f = (byte)uVar7 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
              if (local_135f != 0) {
                auVar20._4_4_ = fVar74 * local_1380._4_4_;
                auVar20._0_4_ = fVar77 * local_1380._0_4_;
                auVar20._8_4_ = fVar80 * local_1380._8_4_;
                auVar20._12_4_ = fVar81 * local_1380._12_4_;
                auVar20._16_4_ = local_1380._16_4_ * 0.0;
                auVar20._20_4_ = local_1380._20_4_ * 0.0;
                auVar20._24_4_ = local_1380._24_4_ * 0.0;
                auVar20._28_4_ = local_1380._28_4_;
                auVar63 = vfmadd213ps_fma(auVar69,ZEXT1632(auVar54),auVar20);
                auVar63 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar39),ZEXT1632(auVar63));
                local_13a0._0_4_ = (float)(uVar92 ^ auVar63._0_4_);
                local_13a0._4_4_ = (float)(uVar94 ^ auVar63._4_4_);
                local_13a0._8_4_ = (float)(uVar95 ^ auVar63._8_4_);
                local_13a0._12_4_ = (float)(uVar96 ^ auVar63._12_4_);
                local_13a0._16_4_ = fVar97;
                local_13a0._20_4_ = fVar98;
                local_13a0._24_4_ = fVar99;
                local_13a0._28_4_ = fVar100;
                uVar75 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar12._4_4_ = uVar75;
                auVar12._0_4_ = uVar75;
                auVar12._8_4_ = uVar75;
                auVar12._12_4_ = uVar75;
                auVar12._16_4_ = uVar75;
                auVar12._20_4_ = uVar75;
                auVar12._24_4_ = uVar75;
                auVar12._28_4_ = uVar75;
                auVar66 = vmulps_avx512vl(local_1380,auVar12);
                uVar7 = vcmpps_avx512vl(auVar66,local_13a0,1);
                fVar100 = ray->tfar;
                auVar13._4_4_ = fVar100;
                auVar13._0_4_ = fVar100;
                auVar13._8_4_ = fVar100;
                auVar13._12_4_ = fVar100;
                auVar13._16_4_ = fVar100;
                auVar13._20_4_ = fVar100;
                auVar13._24_4_ = fVar100;
                auVar13._28_4_ = fVar100;
                auVar66 = vmulps_avx512vl(local_1380,auVar13);
                uVar8 = vcmpps_avx512vl(local_13a0,auVar66,2);
                local_135f = (byte)uVar7 & (byte)uVar8 & local_135f;
                if (local_135f != 0) {
                  auVar66 = vsubps_avx(local_1380,auVar90);
                  local_13e0 = vblendps_avx(auVar87,auVar66,0xf0);
                  auVar66 = vsubps_avx(local_1380,auVar87);
                  local_13c0 = vblendps_avx(auVar90,auVar66,0xf0);
                  local_12e0._0_4_ = auVar39._0_4_ * 1.0;
                  local_12e0._4_4_ = auVar39._4_4_ * 1.0;
                  local_12e0._8_4_ = auVar39._8_4_ * 1.0;
                  local_12e0._12_4_ = auVar39._12_4_ * 1.0;
                  local_12e0._16_4_ = 0x80000000;
                  local_12e0._20_4_ = 0x80000000;
                  local_12e0._24_4_ = 0x80000000;
                  local_12e0._28_4_ = 0;
                  local_12c0._4_4_ = auVar54._4_4_ * 1.0;
                  local_12c0._0_4_ = auVar54._0_4_ * 1.0;
                  local_12c0._8_4_ = auVar54._8_4_ * 1.0;
                  local_12c0._12_4_ = auVar54._12_4_ * 1.0;
                  local_12c0._16_4_ = 0x80000000;
                  local_12c0._20_4_ = 0x80000000;
                  local_12c0._24_4_ = 0x80000000;
                  local_12c0._28_4_ = 0;
                  local_12a0._4_4_ = fVar74 * 1.0;
                  local_12a0._0_4_ = fVar77 * 1.0;
                  local_12a0._8_4_ = fVar80 * 1.0;
                  local_12a0._12_4_ = fVar81 * 1.0;
                  local_12a0._16_4_ = 0x80000000;
                  local_12a0._20_4_ = 0x80000000;
                  local_12a0._24_4_ = 0x80000000;
                  local_12a0._28_4_ = 0;
                  auVar66 = vrcp14ps_avx512vl(local_1380);
                  auVar14._8_4_ = 0x3f800000;
                  auVar14._0_8_ = &DAT_3f8000003f800000;
                  auVar14._12_4_ = 0x3f800000;
                  auVar14._16_4_ = 0x3f800000;
                  auVar14._20_4_ = 0x3f800000;
                  auVar14._24_4_ = 0x3f800000;
                  auVar14._28_4_ = 0x3f800000;
                  auVar67 = vfnmadd213ps_avx512vl(local_1380,auVar66,auVar14);
                  auVar63 = vfmadd132ps_fma(auVar67,auVar66,auVar66);
                  fVar77 = auVar63._0_4_;
                  fVar74 = auVar63._4_4_;
                  fVar80 = auVar63._8_4_;
                  fVar81 = auVar63._12_4_;
                  uStack_12e4 = auVar66._28_4_;
                  local_1300[0] = fVar77 * local_13a0._0_4_;
                  local_1300[1] = fVar74 * local_13a0._4_4_;
                  local_1300[2] = fVar80 * local_13a0._8_4_;
                  local_1300[3] = fVar81 * local_13a0._12_4_;
                  fStack_12f0 = fVar97 * 0.0;
                  fStack_12ec = fVar98 * 0.0;
                  fStack_12e8 = fVar99 * 0.0;
                  local_1340[0] = local_13e0._0_4_ * fVar77;
                  local_1340[1] = local_13e0._4_4_ * fVar74;
                  local_1340[2] = local_13e0._8_4_ * fVar80;
                  local_1340[3] = local_13e0._12_4_ * fVar81;
                  fStack_1330 = local_13e0._16_4_ * 0.0;
                  fStack_132c = local_13e0._20_4_ * 0.0;
                  fStack_1328 = local_13e0._24_4_ * 0.0;
                  uStack_1324 = uStack_12e4;
                  local_1320._4_4_ = local_13c0._4_4_ * fVar74;
                  local_1320._0_4_ = local_13c0._0_4_ * fVar77;
                  local_1320._8_4_ = local_13c0._8_4_ * fVar80;
                  local_1320._12_4_ = local_13c0._12_4_ * fVar81;
                  local_1320._16_4_ = local_13c0._16_4_ * 0.0;
                  local_1320._20_4_ = local_13c0._20_4_ * 0.0;
                  local_1320._24_4_ = local_13c0._24_4_ * 0.0;
                  local_1320._28_4_ = uStack_12e4;
                  uVar23 = (ulong)local_135f;
                  do {
                    auVar63 = auVar106._0_16_;
                    local_1510 = 0;
                    for (uVar25 = uVar23; (uVar25 & 1) == 0;
                        uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                      local_1510 = local_1510 + 1;
                    }
                    local_14e8 = *(uint *)((long)&local_1220 + local_1510 * 4);
                    pGVar4 = (local_1518->geometries).items[local_14e8].ptr;
                    if ((pGVar4->mask & ray->mask) == 0) {
                      uVar23 = uVar23 ^ 1L << (local_1510 & 0x3f);
                      bVar21 = true;
                    }
                    else {
                      local_1560 = context->args;
                      if ((local_1560->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar21 = false;
                      }
                      else {
                        local_1280 = auVar108._0_32_;
                        local_1260 = auVar107._0_32_;
                        uVar25 = (ulong)(uint)((int)local_1510 * 4);
                        local_14f4 = *(undefined4 *)((long)local_1340 + uVar25);
                        local_14f0 = *(undefined4 *)(local_1320 + uVar25);
                        local_14d0.context = context->user;
                        local_14ec = *(undefined4 *)((long)&local_1240 + uVar25);
                        local_1500 = *(undefined4 *)(local_12e0 + uVar25);
                        local_14fc = *(undefined4 *)(local_12c0 + uVar25);
                        local_14f8 = *(undefined4 *)(local_12a0 + uVar25);
                        local_14e4 = (local_14d0.context)->instID[0];
                        local_14e0 = (local_14d0.context)->instPrimID[0];
                        fVar77 = ray->tfar;
                        ray->tfar = *(float *)((long)local_1300 + uVar25);
                        local_1564 = -1;
                        local_14d0.valid = &local_1564;
                        local_14d0.geometryUserPtr = pGVar4->userPtr;
                        local_14d0.hit = (RTCHitN *)&local_1500;
                        local_14d0.N = 1;
                        local_14d0.ray = (RTCRayN *)ray;
                        if ((pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar4->occlusionFilterN)(&local_14d0), *local_14d0.valid != 0)) {
                          if (local_1560->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1560->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                              (*local_1560->filter)(&local_14d0);
                            }
                            if (*local_14d0.valid == 0) goto LAB_0072a1d0;
                          }
                          bVar21 = false;
                        }
                        else {
LAB_0072a1d0:
                          ray->tfar = fVar77;
                          uVar23 = uVar23 ^ 1L << (local_1510 & 0x3f);
                          bVar21 = true;
                        }
                        auVar63 = vxorps_avx512vl(auVar63,auVar63);
                        auVar106 = ZEXT1664(auVar63);
                        auVar107 = ZEXT3264(local_1260);
                        auVar108 = ZEXT3264(local_1280);
                      }
                    }
                    if (!bVar21) {
                      auVar91 = ZEXT3264(local_1400);
                      auVar83 = ZEXT3264(local_1420);
                      auVar93 = ZEXT3264(local_1440);
                      auVar85 = ZEXT3264(local_1460);
                      auVar88 = ZEXT3264(local_1480);
                      auVar102 = ZEXT3264(local_14a0);
                      iVar26 = 0;
                      lVar27 = local_1530;
                      lVar29 = local_1538;
                      lVar31 = local_1540;
                      lVar32 = local_1548;
                      lVar33 = local_1550;
                      lVar34 = local_1558;
                      if (bVar37) {
                        ray->tfar = -INFINITY;
                        iVar26 = 3;
                      }
                      goto LAB_0072a26b;
                    }
                  } while (uVar23 != 0);
                }
              }
              uVar22 = uVar22 + 1;
              bVar37 = uVar22 < local_1508;
            } while (uVar22 != local_1508);
            auVar91 = ZEXT3264(local_1400);
            auVar83 = ZEXT3264(local_1420);
            auVar93 = ZEXT3264(local_1440);
            auVar85 = ZEXT3264(local_1460);
            auVar88 = ZEXT3264(local_1480);
            auVar102 = ZEXT3264(local_14a0);
            iVar26 = 0;
            lVar27 = local_1530;
            lVar29 = local_1538;
            lVar31 = local_1540;
            lVar32 = local_1548;
            lVar33 = local_1550;
            lVar34 = local_1558;
          }
        }
LAB_0072a26b:
        unaff_R15 = local_1528;
      } while (iVar26 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }